

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

PClassActor ** __thiscall
TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::Insert
          (TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_> *this,int key,
          PClassActor **value)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = this->Nodes + (this->Size - 1 & key);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key == key) {
LAB_0045c69b:
      (pNVar2->Pair).Value = *value;
      return &(pNVar2->Pair).Value;
    }
  }
  pNVar2 = NewKey(this,key);
  goto LAB_0045c69b;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}